

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonReader.h
# Opt level: O3

void __thiscall Json::JsonReader::JsonReader(JsonReader *this,FILE *fp)

{
  int iVar1;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"");
  (this->__JSON)._M_dataplus._M_p = (pointer)&(this->__JSON).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)this,local_40,local_38 + (long)local_40);
  this->__ptr = 0;
  this->__len = (int)(this->__JSON)._M_string_length;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  if (fp != (FILE *)0x0) {
    while( true ) {
      iVar1 = fgetc((FILE *)fp);
      if ((char)iVar1 == -1) break;
      std::__cxx11::string::push_back((char)this);
    }
    this->__len = (int)(this->__JSON)._M_string_length;
  }
  return;
}

Assistant:

explicit JsonReader(FILE *fp) : JsonReader("") {
            if (fp) {
                char c;
                while ((c = fgetc(fp)) != EOF) __JSON += c;
                __len = __JSON.size();
            }
        }